

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall QOpenGLTexture::setMipLevels(QOpenGLTexture *this,int levels)

{
  Target TVar1;
  QOpenGLTexturePrivate *this_00;
  char *pcVar2;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this->d_ptr).d)->storageAllocated == true) {
    pcVar2 = 
    "Cannot set mip levels on a texture that already has storage allocated.\nTo do so, destroy() the texture and then create() and setMipLevels()"
    ;
  }
  else {
    TVar1 = this_00->target;
    if (((((TVar1 - Target1D < 2) || (TVar1 == Target3D)) || (TVar1 == TargetCubeMap)) ||
        ((TVar1 == Target1DArray || (TVar1 == Target2DArray)))) || (TVar1 == TargetCubeMapArray)) {
      this_00->requestedMipLevels = levels;
      goto LAB_00153153;
    }
    if (((TVar1 != TargetRectangle) && (TVar1 != TargetBuffer)) &&
       ((TVar1 != Target2DMultisample && (TVar1 != Target2DMultisampleArray)))) goto LAB_00153153;
    pcVar2 = "QAbstractOpenGLTexture::setMipLevels(): This texture target does not support mipmaps";
  }
  local_28 = "default";
  local_40[0x14] = '\0';
  local_40[0x15] = '\0';
  local_40[0x16] = '\0';
  local_40[0x17] = '\0';
  local_40[0xc] = '\0';
  local_40[0xd] = '\0';
  local_40[0xe] = '\0';
  local_40[0xf] = '\0';
  local_40[0x10] = '\0';
  local_40[0x11] = '\0';
  local_40[0x12] = '\0';
  local_40[0x13] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[10] = '\0';
  local_40[0xb] = '\0';
  local_40[0] = '\x02';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  QMessageLogger::warning(local_40,pcVar2);
LAB_00153153:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setMipLevels(int levels)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (isStorageAllocated()) {
        qWarning("Cannot set mip levels on a texture that already has storage allocated.\n"
                 "To do so, destroy() the texture and then create() and setMipLevels()");
        return;
    }

    switch (d->target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
    case QOpenGLTexture::Target3D:
        d->requestedMipLevels = levels;
        break;

    case QOpenGLTexture::TargetBuffer:
    case QOpenGLTexture::TargetRectangle:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
        qWarning("QAbstractOpenGLTexture::setMipLevels(): This texture target does not support mipmaps");
        break;
    }
}